

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlineedit.cpp
# Opt level: O2

void __thiscall QLineEdit::changeEvent(QLineEdit *this,QEvent *ev)

{
  short sVar1;
  long lVar2;
  QLineEditPrivate *this_00;
  QWidgetLineControl *pQVar3;
  pointer pSVar4;
  QWidget *this_01;
  char cVar5;
  QChar character;
  int iVar6;
  QPalette *pQVar7;
  QStyle *pQVar8;
  SideWidgetEntry *e;
  pointer pSVar9;
  long in_FS_OFFSET;
  QStyleOptionFrame opt;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QLineEditPrivate **)&(this->super_QWidget).field_0x8;
  sVar1 = *(short *)(ev + 8);
  if (sVar1 == 0x5a) {
    pSVar4 = (this_00->trailingSideWidgets).
             super__Vector_base<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pSVar9 = (this_00->trailingSideWidgets).
                  super__Vector_base<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>
                  ._M_impl.super__Vector_impl_data._M_start; pSVar9 != pSVar4; pSVar9 = pSVar9 + 1)
    {
      if ((pSVar9->flags & 4) != 0) {
        this_01 = pSVar9->widget;
        QLineEditPrivate::clearButtonIcon((QLineEditPrivate *)&opt);
        QAbstractButton::setIcon((QAbstractButton *)this_01,(QIcon *)&opt);
        QIcon::~QIcon((QIcon *)&opt);
      }
    }
    QLineEditPrivate::positionSideWidgets(this_00);
  }
  else if (sVar1 == 0x61) {
    QWidgetLineControl::setFont
              ((QWidgetLineControl *)this_00->control,&((this->super_QWidget).data)->fnt);
  }
  else {
    if (sVar1 == 100) {
      opt._64_8_ = &DAT_aaaaaaaaaaaaaaaa;
      opt._72_8_ = &DAT_aaaaaaaaaaaaaaaa;
      opt.super_QStyleOption.palette._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      opt.super_QStyleOption.styleObject = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
      opt.super_QStyleOption._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
      opt.super_QStyleOption.palette.d = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
      opt.super_QStyleOption.rect._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      opt.super_QStyleOption.rect._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      opt.super_QStyleOption._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      opt.super_QStyleOption._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QStyleOptionFrame::QStyleOptionFrame(&opt);
      (**(code **)(*(long *)&this->super_QWidget + 0x1a0))(this,&opt);
      pQVar3 = this_00->control;
      pQVar8 = QWidget::style(&this->super_QWidget);
      character.ucs = (**(code **)(*(long *)pQVar8 + 0xf0))(pQVar8,0x23,&opt,this,0);
      QWidgetLineControl::setPasswordCharacter((QWidgetLineControl *)pQVar3,character);
      pQVar3 = this_00->control;
      pQVar8 = QWidget::style(&this->super_QWidget);
      iVar6 = (**(code **)(*(long *)pQVar8 + 0xf0))(pQVar8,0x67,&opt,this,0);
      pQVar3->m_passwordMaskDelay = iVar6;
      QStyleOption::~QStyleOption(&opt.super_QStyleOption);
    }
    else {
      if (sVar1 != 99) goto LAB_003ef255;
      pQVar7 = QWidget::palette(&this->super_QWidget);
      cVar5 = QPalette::isEqual((ColorGroup)pQVar7,Active);
      if (cVar5 != '\0') goto LAB_003ef255;
    }
    QWidget::update(&this->super_QWidget);
  }
LAB_003ef255:
  QWidget::changeEvent(&this->super_QWidget,ev);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QLineEdit::changeEvent(QEvent *ev)
{
    Q_D(QLineEdit);
    switch(ev->type())
    {
    case QEvent::ActivationChange:
        if (!palette().isEqual(QPalette::Active, QPalette::Inactive))
            update();
        break;
    case QEvent::FontChange:
        d->control->setFont(font());
        break;
    case QEvent::StyleChange:
        {
            QStyleOptionFrame opt;
            initStyleOption(&opt);
            d->control->setPasswordCharacter(char16_t(style()->styleHint(QStyle::SH_LineEdit_PasswordCharacter, &opt, this)));
            d->control->setPasswordMaskDelay(style()->styleHint(QStyle::SH_LineEdit_PasswordMaskDelay, &opt, this));
        }
        update();
        break;
    case QEvent::LayoutDirectionChange:
#if QT_CONFIG(toolbutton)
        for (const auto &e : d->trailingSideWidgets) { // Refresh icon to show arrow in right direction.
            if (e.flags & QLineEditPrivate::SideWidgetClearButton)
                static_cast<QLineEditIconButton *>(e.widget)->setIcon(d->clearButtonIcon());
        }
#endif
        d->positionSideWidgets();
        break;
    default:
        break;
    }
    QWidget::changeEvent(ev);
}